

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O2

void LzmaDec_WriteRem(CLzmaDec *p,SizeT limit)

{
  uint uVar1;
  uint uVar2;
  UInt32 UVar3;
  Byte *pBVar4;
  SizeT SVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  UInt32 UVar10;
  SizeT SVar11;
  ulong uVar9;
  
  uVar1 = p->remainLen;
  if (uVar1 - 1 < 0x111) {
    pBVar4 = p->dic;
    uVar6 = p->dicPos;
    uVar2 = p->reps[0];
    uVar9 = limit - uVar6 & 0xffffffff;
    if ((ulong)uVar1 <= limit - uVar6) {
      uVar9 = (ulong)uVar1;
    }
    uVar7 = (uint)uVar9;
    if (p->checkDicSize == 0) {
      UVar3 = (p->prop).dicSize;
      UVar10 = p->processedPos;
      if (UVar3 - UVar10 <= uVar7) {
        p->checkDicSize = UVar3;
      }
    }
    else {
      UVar10 = p->processedPos;
    }
    SVar5 = p->dicBufSize;
    p->processedPos = UVar10 + uVar7;
    p->remainLen = uVar1 - uVar7;
    while (iVar8 = (int)uVar9, uVar9 = (ulong)(iVar8 - 1), iVar8 != 0) {
      SVar11 = 0;
      if (uVar6 < uVar2) {
        SVar11 = SVar5;
      }
      pBVar4[uVar6] = pBVar4[uVar6 + (SVar11 - uVar2)];
      uVar6 = uVar6 + 1;
    }
    p->dicPos = uVar6;
  }
  return;
}

Assistant:

static void MY_FAST_CALL LzmaDec_WriteRem(CLzmaDec *p, SizeT limit)
{
  if (p->remainLen != 0 && p->remainLen < kMatchSpecLenStart)
  {
    Byte *dic = p->dic;
    SizeT dicPos = p->dicPos;
    SizeT dicBufSize = p->dicBufSize;
    unsigned len = p->remainLen;
    SizeT rep0 = p->reps[0]; /* we use SizeT to avoid the BUG of VC14 for AMD64 */
    SizeT rem = limit - dicPos;
    if (rem < len)
      len = (unsigned)(rem);

    if (p->checkDicSize == 0 && p->prop.dicSize - p->processedPos <= len)
      p->checkDicSize = p->prop.dicSize;

    p->processedPos += len;
    p->remainLen -= len;
    while (len != 0)
    {
      len--;
      dic[dicPos] = dic[dicPos - rep0 + (dicPos < rep0 ? dicBufSize : 0)];
      dicPos++;
    }
    p->dicPos = dicPos;
  }
}